

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool readFromFile<float,short>
               (string *fname,TWaveformT<short> *res,TTrainKeys *trainKeys,
               int32_t *bufferSize_frames)

{
  byte bVar1;
  bool bVar2;
  int *in_RCX;
  string *in_RDI;
  TKey keyPressed;
  streamsize size;
  int32_t offset;
  ifstream fin;
  undefined4 local_254;
  ulong local_250;
  undefined4 in_stack_fffffffffffffdb8;
  int iVar3;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  char local_230 [88];
  streamsize in_stack_fffffffffffffe28;
  int32_t in_stack_fffffffffffffe34;
  TWaveformT<short> *in_stack_fffffffffffffe38;
  ifstream *in_stack_fffffffffffffe40;
  bool local_1;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bb764);
  std::ifstream::ifstream(local_230,in_RDI,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    *in_RCX = 1;
    std::istream::read(local_230,(long)in_RCX);
    iVar3 = 0;
    local_250 = (long)*in_RCX << 0xb;
    do {
      local_254 = 0;
      std::istream::read(local_230,(long)&local_254);
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (value_type_conflict2 *)CONCAT44(iVar3,in_stack_fffffffffffffdb8));
      bVar2 = (anonymous_namespace)::readWaveform<float,short>
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
      if (!bVar2) {
        local_1 = false;
        goto LAB_001bb90f;
      }
      iVar3 = iVar3 + (int)(local_250 >> 2);
      bVar1 = std::ios::eof();
    } while ((bVar1 & 1) == 0);
    std::ifstream::close();
    local_1 = true;
  }
LAB_001bb90f:
  std::ifstream::~ifstream(local_230);
  return local_1;
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res, TTrainKeys & trainKeys, int32_t & bufferSize_frames) {
    trainKeys.clear();

    std::ifstream fin(fname, std::ios::binary);
    if (fin.good() == false) {
        return false;
    }

    bufferSize_frames = 1;
    fin.read((char *)(&bufferSize_frames), sizeof(bufferSize_frames));

    {
        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        int32_t offset = 0;
        std::streamsize size = bufferSize_frames*kSamplesPerFrame*sizeof(TSampleInput);
        while (true) {
            TKey keyPressed = 0;
            fin.read((char *)(&keyPressed), sizeof(keyPressed));
            if (fin.eof()) break;
            trainKeys.push_back(keyPressed);

            if (readWaveform<TSampleInput>(fin, res, offset, size) == false) {
                return false;
            }

            offset += size/sizeof(TSampleInput);
            if (fin.eof()) break;
        }
    }

    fin.close();

    return true;
}